

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

string * __thiscall pbrt::ProjectiveCamera::BaseToString_abi_cxx11_(ProjectiveCamera *this)

{
  string *in_RDI;
  CameraBase *in_stack_00000010;
  Transform *in_stack_ffffffffffffffa8;
  Transform *in_stack_ffffffffffffffb0;
  Transform *in_stack_ffffffffffffffb8;
  Transform *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  string local_30 [16];
  float *in_stack_ffffffffffffffe0;
  float *in_stack_ffffffffffffffe8;
  
  CameraBase::ToString_abi_cxx11_(in_stack_00000010);
  StringPrintf<pbrt::Transform_const&,pbrt::Transform_const&,pbrt::Transform_const&,pbrt::Transform_const&,float_const&,float_const&>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffe8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffb8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string ProjectiveCamera::BaseToString() const {
    return CameraBase::ToString() +
           StringPrintf("screenFromCamera: %s cameraFromRaster: %s "
                        "rasterFromScreen: %s screenFromRaster: %s "
                        "lensRadius: %f focalDistance: %f",
                        screenFromCamera, cameraFromRaster, rasterFromScreen,
                        screenFromRaster, lensRadius, focalDistance);
}